

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall
cmCTestLaunch::DumpFileToXML(cmCTestLaunch *this,cmXMLElement *e3,char *tag,string *fname)

{
  pointer pRVar1;
  bool bVar2;
  RegularExpression *r;
  pointer pRVar3;
  cmXMLElement e4;
  char *sep;
  string line;
  ifstream fin;
  cmXMLElement local_288;
  char *local_280;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_280 = "";
  cmXMLElement::cmXMLElement(&local_288,e3,tag);
LAB_0018ac23:
  bVar2 = cmsys::SystemTools::GetLineFromStream(local_238,&local_278,(bool *)0x0,-1);
  if (!bVar2) {
    cmXMLWriter::EndElement(local_288.xmlwr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  if ((this->OptionFilterPrefix)._M_string_length != 0) goto code_r0x0018ac49;
  goto LAB_0018ac5c;
code_r0x0018ac49:
  bVar2 = cmsys::SystemTools::StringStartsWith
                    (&local_278,(this->OptionFilterPrefix)._M_dataplus._M_p);
  if (!bVar2) {
LAB_0018ac5c:
    pRVar1 = (this->RegexWarningSuppress).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar3 = (this->RegexWarningSuppress).
                  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1)
    {
      bVar2 = cmsys::RegularExpression::find(pRVar3,local_278._M_dataplus._M_p,&pRVar3->regmatch);
      if (bVar2) {
        std::operator+(&local_258,"[CTest: warning suppressed] ",&local_278);
        goto LAB_0018ace2;
      }
    }
    pRVar3 = (this->RegexWarning).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->RegexWarning).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pRVar3 == pRVar1) goto LAB_0018ad09;
      bVar2 = cmsys::RegularExpression::find(pRVar3,local_278._M_dataplus._M_p,&pRVar3->regmatch);
      if (bVar2) break;
      pRVar3 = pRVar3 + 1;
    }
    std::operator+(&local_258,"[CTest: warning matched] ",&local_278);
LAB_0018ace2:
    std::__cxx11::string::operator=((string *)&local_278,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
LAB_0018ad09:
    cmXMLWriter::Content<char_const*>(local_288.xmlwr,&local_280);
    cmXMLWriter::Content<std::__cxx11::string>(local_288.xmlwr,&local_278);
    local_280 = "\n";
  }
  goto LAB_0018ac23;
}

Assistant:

void cmCTestLaunch::DumpFileToXML(cmXMLElement& e3, const char* tag,
                                  std::string const& fname)
{
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);

  std::string line;
  const char* sep = "";

  cmXMLElement e4(e3, tag);
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (MatchesFilterPrefix(line)) {
      continue;
    }
    if (this->Match(line, this->RegexWarningSuppress)) {
      line = "[CTest: warning suppressed] " + line;
    } else if (this->Match(line, this->RegexWarning)) {
      line = "[CTest: warning matched] " + line;
    }
    e4.Content(sep);
    e4.Content(line);
    sep = "\n";
  }
}